

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS
ref_update_agent_tet_seed
          (REF_INTERP ref_interp,REF_INT id,REF_INT node0,REF_INT node1,REF_INT node2)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell;
  int iVar1;
  REF_GLOB local_78;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rsb;
  REF_INT node;
  REF_INT tri;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT face_nodes [4];
  REF_AGENTS ref_agents;
  REF_CELL tris;
  REF_CELL tets;
  REF_NODE ref_node;
  REF_INT node2_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_INT id_local;
  REF_INTERP ref_interp_local;
  
  ref_node_00 = ref_interp->from_grid->node;
  ref_cell = ref_interp->from_tri;
  face_nodes._8_8_ = ref_interp->ref_agents;
  cell1 = node0;
  cell0 = node1;
  face_nodes[0] = node2;
  face_nodes[1] = node0;
  ref_interp_local._4_4_ = ref_cell_with_face(ref_interp->from_tet,&cell1,&tri,&node);
  if (ref_interp_local._4_4_ == 0) {
    if (tri == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x209,"ref_update_agent_tet_seed","bary update missing first");
      ref_interp_local._4_4_ = 1;
    }
    else if (node == -1) {
      if (((ref_node_00->ref_mpi->id == ref_node_00->part[node0]) ||
          (ref_node_00->ref_mpi->id == ref_node_00->part[node1])) ||
         (ref_node_00->ref_mpi->id == ref_node_00->part[node2])) {
        ref_interp_local._4_4_ = ref_cell_with(ref_cell,&cell1,&ref_private_macro_code_rsb);
        if (ref_interp_local._4_4_ == 0) {
          *(undefined4 *)(*(long *)(face_nodes._8_8_ + 0x10) + (long)id * 0x68) = 2;
          ref_interp_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x217,"ref_update_agent_tet_seed",(ulong)ref_interp_local._4_4_,
                 "boundary tri expected");
        }
      }
      else {
        iVar1 = rand();
        iVar1 = (&cell1)[iVar1 % 3];
        *(REF_INT *)(*(long *)(face_nodes._8_8_ + 0x10) + (long)id * 0x68 + 0x14) =
             ref_node_00->part[iVar1];
        *(undefined4 *)(*(long *)(face_nodes._8_8_ + 0x10) + (long)id * 0x68 + 0x18) = 0xffffffff;
        if (((iVar1 < 0) || (ref_node_00->max <= iVar1)) || (ref_node_00->global[iVar1] < 0)) {
          local_78 = -1;
        }
        else {
          local_78 = ref_node_00->global[iVar1];
        }
        *(REF_GLOB *)(*(long *)(face_nodes._8_8_ + 0x10) + (long)id * 0x68 + 0x20) = local_78;
        *(undefined4 *)(*(long *)(face_nodes._8_8_ + 0x10) + (long)id * 0x68) = 3;
        ref_interp_local._4_4_ = 0;
      }
    }
    else if (*(int *)(*(long *)(face_nodes._8_8_ + 0x10) + (long)id * 0x68 + 0x18) == tri) {
      *(REF_INT *)(*(long *)(face_nodes._8_8_ + 0x10) + (long)id * 0x68 + 0x18) = node;
      ref_interp_local._4_4_ = 0;
    }
    else if (*(int *)(*(long *)(face_nodes._8_8_ + 0x10) + (long)id * 0x68 + 0x18) == node) {
      *(REF_INT *)(*(long *)(face_nodes._8_8_ + 0x10) + (long)id * 0x68 + 0x18) = tri;
      ref_interp_local._4_4_ = 0;
    }
    else {
      ref_interp_local._4_4_ = 5;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x208,
           "ref_update_agent_tet_seed",(ulong)ref_interp_local._4_4_,"cells with walk face");
    ref_node_location(ref_node_00,cell1);
    ref_node_location(ref_node_00,cell0);
    ref_node_location(ref_node_00,face_nodes[0]);
    ref_node_location(ref_node_00,face_nodes[1]);
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_update_agent_tet_seed(REF_INTERP ref_interp,
                                                    REF_INT id, REF_INT node0,
                                                    REF_INT node1,
                                                    REF_INT node2) {
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_CELL tets = ref_interp_from_tet(ref_interp);
  REF_CELL tris = ref_interp_from_tri(ref_interp);
  REF_AGENTS ref_agents = ref_interp->ref_agents;
  REF_INT face_nodes[4], cell0, cell1;
  REF_INT tri, node;

  face_nodes[0] = node0;
  face_nodes[1] = node1;
  face_nodes[2] = node2;
  face_nodes[3] = node0;

  RSB(ref_cell_with_face(tets, face_nodes, &cell0, &cell1),
      "cells with walk face", {
        ref_node_location(ref_node, face_nodes[0]);
        ref_node_location(ref_node, face_nodes[1]);
        ref_node_location(ref_node, face_nodes[2]);
        ref_node_location(ref_node, face_nodes[3]);
      });
  if (REF_EMPTY == cell0) THROW("bary update missing first");
  if (REF_EMPTY == cell1) {
    /* if it is off proc */
    if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1) &&
        !ref_node_owned(ref_node, node2)) {
      /* pick at pseudo random */
      node = face_nodes[rand() % 3];
      ref_agent_part(ref_agents, id) = ref_node_part(ref_node, node);
      ref_agent_seed(ref_agents, id) = REF_EMPTY;
      ref_agent_global(ref_agents, id) = ref_node_global(ref_node, node);
      ref_agent_mode(ref_agents, id) = REF_AGENT_HOP_PART;
      return REF_SUCCESS;
    }
    /* hit boundary, but verifying */
    RSS(ref_cell_with(tris, face_nodes, &tri), "boundary tri expected");
    ref_agent_mode(ref_agents, id) = REF_AGENT_AT_BOUNDARY;
    return REF_SUCCESS;
  }

  if (ref_agent_seed(ref_agents, id) == cell0) {
    ref_agent_seed(ref_agents, id) = cell1;
    return REF_SUCCESS;
  }
  if (ref_agent_seed(ref_agents, id) == cell1) {
    ref_agent_seed(ref_agents, id) = cell0;
    return REF_SUCCESS;
  }

  return REF_NOT_FOUND;
}